

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_tools_visuals.cxx
# Opt level: O1

void __thiscall level_tools::paint_debug_cform(level_tools *this,xr_surface *surface,uint16_t flags)

{
  char *pcVar1;
  bool bVar2;
  char *pcVar3;
  
  pcVar1 = (surface->m_gamemtl)._M_dataplus._M_p;
  bVar2 = xray_re::xr_ini_file::line_exist(this->m_ini,"debug_cform_textures",pcVar1);
  if (bVar2) {
    pcVar3 = xray_re::xr_ini_file::r_string(this->m_ini,"debug_cform_textures",pcVar1);
    pcVar1 = (char *)(surface->m_texture)._M_string_length;
    strlen(pcVar3);
    std::__cxx11::string::_M_replace((ulong)&surface->m_texture,0,pcVar1,(ulong)pcVar3);
  }
  else {
    xray_re::msg("can\'t assign texture for game material %s");
  }
  if ((flags & 1) == 0) {
    pcVar1 = this->m_ghost_eshader;
    pcVar3 = (char *)(surface->m_eshader)._M_string_length;
    strlen(pcVar1);
    std::__cxx11::string::_M_replace((ulong)&surface->m_eshader,0,pcVar3,(ulong)pcVar1);
    return;
  }
  return;
}

Assistant:

void level_tools::paint_debug_cform(xr_surface* surface, uint16_t flags) const
{
	const char* gamemtl = surface->gamemtl().c_str();
	if (m_ini->line_exist("debug_cform_textures", gamemtl))
		surface->texture() = m_ini->r_string("debug_cform_textures", gamemtl);
	else
		msg("can't assign texture for game material %s", gamemtl);
	if ((flags & RSF_COLLISION) == 0)
		surface->eshader() = m_ghost_eshader;
}